

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromCollations(CollationLoader *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  UResourceBundle *pUVar3;
  size_t sVar4;
  CollationCacheEntry *entryFromCache;
  CollationCacheEntry *entry;
  char local_51;
  char *pcStack_50;
  UBool actualAndValidLocalesAreDifferent;
  char *vLocale;
  char *actualLocale;
  int local_2c;
  int32_t typeLength;
  LocalUResourceBundlePointer localData;
  UErrorCode *errorCode_local;
  CollationLoader *this_local;
  
  localData.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return (CollationCacheEntry *)0x0;
  }
  pUVar3 = ures_getByKeyWithFallback_63
                     (this->collations,this->type,(UResourceBundle *)0x0,
                      (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd8,pUVar3);
  sVar4 = strlen(this->type);
  local_2c = (int)sVar4;
  if (*(int *)localData.super_LocalPointerBase<UResourceBundle>.ptr == 2) {
    *(undefined4 *)localData.super_LocalPointerBase<UResourceBundle>.ptr = 0xffffff81;
    this->typeFallback = '\x01';
    if ((((this->typesTried & 1) == 0) && (6 < local_2c)) &&
       (iVar2 = strncmp(this->type,"search",6), iVar2 == 0)) {
      this->typesTried = this->typesTried | 1;
      this->type[6] = '\0';
    }
    else if ((this->typesTried & 2) == 0) {
      this->typesTried = this->typesTried | 2;
      strcpy(this->type,this->defaultType);
    }
    else {
      if ((this->typesTried & 4) != 0) {
        this_local = (CollationLoader *)
                     makeCacheEntryFromRoot
                               (this,&this->validLocale,
                                (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr)
        ;
        goto LAB_0028855b;
      }
      this->typesTried = this->typesTried | 4;
      strcpy(this->type,"standard");
    }
    Locale::setKeywordValue
              (&this->locale,"collation",this->type,
               (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
    this_local = (CollationLoader *)
                 getCacheEntry(this,(UErrorCode *)
                                    localData.super_LocalPointerBase<UResourceBundle>.ptr);
  }
  else {
    UVar1 = ::U_FAILURE(*(UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
    if (UVar1 == '\0') {
      pUVar3 = LocalPointerBase<UResourceBundle>::orphan
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffffd8);
      this->data = pUVar3;
      vLocale = ures_getLocaleByType_63
                          (this->data,ULOC_ACTUAL_LOCALE,
                           (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
      UVar1 = ::U_FAILURE(*(UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
      if (UVar1 == '\0') {
        pcStack_50 = Locale::getBaseName(&this->validLocale);
        iVar2 = strcmp(vLocale,pcStack_50);
        local_51 = iVar2 != 0;
        iVar2 = strcmp(this->type,this->defaultType);
        if (iVar2 != 0) {
          Locale::setKeywordValue
                    (&this->validLocale,"collation",this->type,
                     (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
          UVar1 = ::U_FAILURE(*(UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
          if (UVar1 != '\0') {
            this_local = (CollationLoader *)0x0;
            goto LAB_0028855b;
          }
        }
        if (((*vLocale == '\0') || (iVar2 = strcmp(vLocale,"root"), iVar2 == 0)) &&
           (iVar2 = strcmp(this->type,"standard"), iVar2 == 0)) {
          if (this->typeFallback != '\0') {
            *(undefined4 *)localData.super_LocalPointerBase<UResourceBundle>.ptr = 0xffffff81;
          }
          this_local = (CollationLoader *)
                       makeCacheEntryFromRoot
                                 (this,&this->validLocale,
                                  (UErrorCode *)
                                  localData.super_LocalPointerBase<UResourceBundle>.ptr);
        }
        else {
          Locale::Locale((Locale *)&entry,vLocale,(char *)0x0,(char *)0x0,(char *)0x0);
          Locale::operator=(&this->locale,(Locale *)&entry);
          Locale::~Locale((Locale *)&entry);
          if (local_51 == '\0') {
            this_local = (CollationLoader *)
                         loadFromData(this,(UErrorCode *)
                                           localData.super_LocalPointerBase<UResourceBundle>.ptr);
          }
          else {
            Locale::setKeywordValue
                      (&this->locale,"collation",this->type,
                       (UErrorCode *)localData.super_LocalPointerBase<UResourceBundle>.ptr);
            entryFromCache =
                 getCacheEntry(this,(UErrorCode *)
                                    localData.super_LocalPointerBase<UResourceBundle>.ptr);
            this_local = (CollationLoader *)
                         makeCacheEntry(&this->validLocale,entryFromCache,
                                        (UErrorCode *)
                                        localData.super_LocalPointerBase<UResourceBundle>.ptr);
          }
        }
      }
      else {
        this_local = (CollationLoader *)0x0;
      }
    }
    else {
      this_local = (CollationLoader *)0x0;
    }
  }
LAB_0028855b:
  actualLocale._0_4_ = 1;
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd8);
  return (CollationCacheEntry *)this_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadFromCollations(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return NULL; }
    U_ASSERT(data == NULL);
    // Load the collations/type tailoring, with type fallback.
    LocalUResourceBundlePointer localData(
            ures_getByKeyWithFallback(collations, type, NULL, &errorCode));
    int32_t typeLength = static_cast<int32_t>(uprv_strlen(type));
    if(errorCode == U_MISSING_RESOURCE_ERROR) {
        errorCode = U_USING_DEFAULT_WARNING;
        typeFallback = TRUE;
        if((typesTried & TRIED_SEARCH) == 0 &&
                typeLength > 6 && uprv_strncmp(type, "search", 6) == 0) {
            // fall back from something like "searchjl" to "search"
            typesTried |= TRIED_SEARCH;
            type[6] = 0;
        } else if((typesTried & TRIED_DEFAULT) == 0) {
            // fall back to the default type
            typesTried |= TRIED_DEFAULT;
            uprv_strcpy(type, defaultType);
        } else if((typesTried & TRIED_STANDARD) == 0) {
            // fall back to the "standard" type
            typesTried |= TRIED_STANDARD;
            uprv_strcpy(type, "standard");
        } else {
            // Return the root tailoring with the validLocale, without collation type.
            return makeCacheEntryFromRoot(validLocale, errorCode);
        }
        locale.setKeywordValue("collation", type, errorCode);
        return getCacheEntry(errorCode);
    }
    if(U_FAILURE(errorCode)) { return NULL; }

    data = localData.orphan();
    const char *actualLocale = ures_getLocaleByType(data, ULOC_ACTUAL_LOCALE, &errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    const char *vLocale = validLocale.getBaseName();
    UBool actualAndValidLocalesAreDifferent = uprv_strcmp(actualLocale, vLocale) != 0;

    // Set the collation types on the informational locales,
    // except when they match the default types (for brevity and backwards compatibility).
    // For the valid locale, suppress the default type.
    if(uprv_strcmp(type, defaultType) != 0) {
        validLocale.setKeywordValue("collation", type, errorCode);
        if(U_FAILURE(errorCode)) { return NULL; }
    }

    // Is this the same as the root collator? If so, then use that instead.
    if((*actualLocale == 0 || uprv_strcmp(actualLocale, "root") == 0) &&
            uprv_strcmp(type, "standard") == 0) {
        if(typeFallback) {
            errorCode = U_USING_DEFAULT_WARNING;
        }
        return makeCacheEntryFromRoot(validLocale, errorCode);
    }

    locale = Locale(actualLocale);
    if(actualAndValidLocalesAreDifferent) {
        locale.setKeywordValue("collation", type, errorCode);
        const CollationCacheEntry *entry = getCacheEntry(errorCode);
        return makeCacheEntry(validLocale, entry, errorCode);
    } else {
        return loadFromData(errorCode);
    }
}